

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

edata_t * duckdb_je_extent_alloc_wrapper
                    (tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,void *new_addr,size_t size,
                    size_t alignment,_Bool zero,_Bool *commit,_Bool growing_retained)

{
  int8_t *piVar1;
  atomic_zu_t *paVar2;
  uint64_t uVar3;
  uint uVar4;
  extent_hooks_t *peVar5;
  _Bool _Var6;
  edata_t *edata;
  void *pvVar7;
  tsd_t *ptVar8;
  ulong uVar9;
  size_t sVar10;
  long *in_FS_OFFSET;
  _Bool local_41;
  void *local_40;
  size_t local_38;
  
  local_41 = zero;
  local_38 = size;
  edata = duckdb_je_edata_cache_get(tsdn,pac->edata_cache);
  sVar10 = local_38;
  if (edata != (edata_t *)0x0) {
    uVar9 = alignment + 0xfff & 0xfffffffffffff000;
    peVar5 = (extent_hooks_t *)(ehooks->ptr).repr;
    local_40 = new_addr;
    if (peVar5 == &duckdb_je_ehooks_default_extent_hooks) {
      pvVar7 = duckdb_je_ehooks_default_alloc_impl
                         (tsdn,new_addr,local_38,uVar9,&local_41,commit,ehooks->ind);
    }
    else {
      ptVar8 = &tsdn->tsd;
      if ((tsdn == (tsdn_t *)0x0) &&
         (ptVar8 = (tsd_t *)(*in_FS_OFFSET + -0x2a90), *(char *)(*in_FS_OFFSET + -0x2758) != '\0'))
      {
        ptVar8 = duckdb_je_tsd_fetch_slow(ptVar8,false);
      }
      ptVar8->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
           ptVar8->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
      if ((ptVar8->state).repr == '\0') {
        duckdb_je_tsd_slow_update(ptVar8);
      }
      sVar10 = local_38;
      pvVar7 = (*peVar5->alloc)(peVar5,local_40,local_38,uVar9,&local_41,commit,ehooks->ind);
      ptVar8 = &tsdn->tsd;
      if ((tsdn == (tsdn_t *)0x0) &&
         (ptVar8 = (tsd_t *)(*in_FS_OFFSET + -0x2a90), *(char *)(*in_FS_OFFSET + -0x2758) != '\0'))
      {
        ptVar8 = duckdb_je_tsd_fetch_slow(ptVar8,false);
      }
      piVar1 = &ptVar8->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == '\0') {
        duckdb_je_tsd_slow_update(ptVar8);
      }
    }
    if (pvVar7 != (void *)0x0) {
      uVar4 = (pac->ecache_dirty).ind;
      LOCK();
      paVar2 = &pac->duckdb_je_extent_sn_next;
      uVar3 = paVar2->repr;
      paVar2->repr = paVar2->repr + 1;
      UNLOCK();
      _Var6 = *commit;
      uVar9 = (ulong)duckdb_je_opt_retain;
      edata->e_addr = pvVar7;
      (edata->field_2).e_size_esn = (uint)(edata->field_2).e_size_esn & 0xfff | sVar10;
      edata->e_sn = uVar3;
      edata->e_bits =
           uVar9 << 0x2c |
           (ulong)_Var6 << 0xd | (ulong)local_41 << 0xf | (ulong)(uVar4 & 0xf0000fff) |
           edata->e_bits & 0xffffeffff0000000 | 0xe800000;
      _Var6 = duckdb_je_emap_register_boundary(tsdn,pac->emap,edata,0xe8,false);
      if (!_Var6) {
        return edata;
      }
    }
    duckdb_je_edata_cache_put(tsdn,pac->edata_cache,edata);
  }
  return (edata_t *)0x0;
}

Assistant:

edata_t *
extent_alloc_wrapper(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks,
    void *new_addr, size_t size, size_t alignment, bool zero, bool *commit,
    bool growing_retained) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, growing_retained ? 1 : 0);

	edata_t *edata = edata_cache_get(tsdn, pac->edata_cache);
	if (edata == NULL) {
		return NULL;
	}
	size_t palignment = ALIGNMENT_CEILING(alignment, PAGE);
	void *addr = ehooks_alloc(tsdn, ehooks, new_addr, size, palignment,
	    &zero, commit);
	if (addr == NULL) {
		edata_cache_put(tsdn, pac->edata_cache, edata);
		return NULL;
	}
	edata_init(edata, ecache_ind_get(&pac->ecache_dirty), addr,
	    size, /* slab */ false, SC_NSIZES, extent_sn_next(pac),
	    extent_state_active, zero, *commit, EXTENT_PAI_PAC,
	    opt_retain ? EXTENT_IS_HEAD : EXTENT_NOT_HEAD);
	/*
	 * Retained memory is not counted towards gdump.  Only if an extent is
	 * allocated as a separate mapping, i.e. growing_retained is false, then
	 * gdump should be updated.
	 */
	bool gdump_add = !growing_retained;
	if (extent_register_impl(tsdn, pac, edata, gdump_add)) {
		edata_cache_put(tsdn, pac->edata_cache, edata);
		return NULL;
	}

	return edata;
}